

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O3

blob_metadata * __thiscall
MILBlob::Blob::StorageReader::Impl::GetMetadata
          (blob_metadata *__return_storage_ptr__,Impl *this,uint64_t offset)

{
  BlobDataType BVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t *puVar16;
  runtime_error *this_00;
  Span<const_unsigned_char,_18446744073709551615UL> SVar17;
  anon_class_8_1_8991fb9c load;
  anon_class_8_1_898e71e4 local_28;
  anon_class_8_1_8991fb9c local_20;
  
  local_28.load = &local_20;
  local_20.this = this;
  std::call_once<MILBlob::Blob::StorageReader::Impl::EnsureLoaded()const::_lambda()_2_>
            (&this->m_loadedFlag,&local_28);
  SVar17 = MMapFileReader::ReadData
                     ((this->m_reader)._M_t.
                      super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                      .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                      _M_head_impl,offset,0x40);
  puVar16 = (uint32_t *)SVar17.m_ptr;
  BVar1 = puVar16[1];
  uVar2 = puVar16[2];
  uVar3 = puVar16[3];
  uVar4 = puVar16[4];
  uVar5 = puVar16[5];
  uVar6 = puVar16[6];
  uVar7 = puVar16[7];
  uVar8 = puVar16[8];
  uVar9 = puVar16[9];
  uVar10 = puVar16[10];
  uVar11 = puVar16[0xb];
  uVar12 = puVar16[0xc];
  uVar13 = puVar16[0xd];
  uVar14 = puVar16[0xe];
  uVar15 = puVar16[0xf];
  __return_storage_ptr__->sentinel = *puVar16;
  __return_storage_ptr__->mil_dtype = BVar1;
  *(uint32_t *)&__return_storage_ptr__->sizeInBytes = uVar2;
  *(uint32_t *)((long)&__return_storage_ptr__->sizeInBytes + 4) = uVar3;
  *(uint32_t *)&__return_storage_ptr__->offset = uVar4;
  *(uint32_t *)((long)&__return_storage_ptr__->offset + 4) = uVar5;
  *(uint32_t *)&__return_storage_ptr__->reserved_0 = uVar6;
  *(uint32_t *)((long)&__return_storage_ptr__->reserved_0 + 4) = uVar7;
  *(uint32_t *)&__return_storage_ptr__->reserved_1 = uVar8;
  *(uint32_t *)((long)&__return_storage_ptr__->reserved_1 + 4) = uVar9;
  *(uint32_t *)&__return_storage_ptr__->reserved_2 = uVar10;
  *(uint32_t *)((long)&__return_storage_ptr__->reserved_2 + 4) = uVar11;
  *(uint32_t *)&__return_storage_ptr__->reserved_3 = uVar12;
  *(uint32_t *)((long)&__return_storage_ptr__->reserved_3 + 4) = uVar13;
  *(uint32_t *)&__return_storage_ptr__->reserved_4 = uVar14;
  *(uint32_t *)((long)&__return_storage_ptr__->reserved_4 + 4) = uVar15;
  if (__return_storage_ptr__->sentinel == 0xdeadbeef) {
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid sentinel in blob_metadata.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

blob_metadata GetMetadata(uint64_t offset) const
    {
        EnsureLoaded();

        blob_metadata metadata = m_reader->ReadStruct<blob_metadata>(offset);

        // validate sentinel
        MILVerifyIsTrue(metadata.sentinel == BlobMetadataSentinel,
                        std::runtime_error,
                        "Invalid sentinel in blob_metadata.");
        return metadata;
    }